

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sliced_Wasserstein.h
# Opt level: O0

double __thiscall
Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance
          (Sliced_Wasserstein *this,Sliced_Wasserstein *second)

{
  pointer *this_00;
  pointer *pppVar1;
  pointer *this_01;
  allocator<int> *paVar2;
  allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_> *this_02
  ;
  pointer *this_03;
  pointer *this_04;
  value_type vVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  result_type rVar7;
  invalid_argument *this_05;
  size_type sVar8;
  reference pvVar9;
  double *pdVar10;
  iterator iVar11;
  iterator iVar12;
  iterator iVar13;
  iterator iVar14;
  reference pvVar15;
  reference pvVar16;
  vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *pvVar17;
  reference pvVar18;
  reference pvVar19;
  reference pvVar20;
  const_reference pvVar21;
  const_iterator cVar22;
  const_iterator cVar23;
  const_iterator cVar24;
  const_iterator cVar25;
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> bVar26;
  vector<double,_std::allocator<double>_> *this_06;
  double dVar27;
  double dVar28;
  result_type_conflict1 rVar29;
  double extraout_XMM0_Qa;
  int local_1764;
  double dStack_1760;
  int j_1;
  double f;
  int n;
  int local_16ec;
  undefined1 local_16e8 [4];
  int i_10;
  vector<double,_std::allocator<double>_> v2;
  vector<double,_std::allocator<double>_> v1;
  double step;
  uint kv;
  uint ku;
  double theta2_1;
  double theta1_1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> v;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> u_1;
  double dStack_1660;
  int i_9;
  double local_1658;
  int local_164c;
  value_type local_1648;
  int i_8;
  int b_1;
  int a_1;
  int q_1;
  int p_1;
  double theta_1;
  int i_7;
  int m2;
  int b;
  int a;
  int q;
  int p;
  double theta;
  int local_1608;
  int i_6;
  int m1;
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  anglePerm2;
  undefined1 local_15e0 [8];
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  anglePerm1;
  int i_5;
  vector<int,_std::allocator<int>_> order2;
  undefined1 local_15a0 [8];
  vector<int,_std::allocator<int>_> order1;
  value_type_conflict2 local_1554;
  undefined1 local_1550 [4];
  int i_4;
  vector<int,_std::allocator<int>_> orderp2;
  vector<int,_std::allocator<int>_> orderp1;
  pair<int,_int> local_14f0;
  pair<int,_int> local_14e8;
  double local_14e0;
  double theta2;
  double theta1;
  int j;
  int i_3;
  vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  angles2;
  vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  angles1;
  double u;
  undefined1 local_1488 [4];
  int i_2;
  uniform_real_distribution<double> uni;
  default_random_engine re;
  random_device rd;
  double thresh_x;
  double thresh_y;
  double epsilon;
  double dStack_c8;
  int num_pts_dgm;
  double local_c0;
  int local_b4;
  double dStack_b0;
  int i_1;
  double local_a8;
  int local_9c;
  double dStack_98;
  int i;
  double max_abscissa;
  double max_ordinate;
  double min_abscissa;
  double min_ordinate;
  int n2;
  int n1;
  double sw;
  Persistence_diagram diagram2;
  Persistence_diagram diagram1;
  Sliced_Wasserstein *second_local;
  Sliced_Wasserstein *this_local;
  
  if (this->approx != second->approx) {
    this_05 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_05,"Error: different approx values for representations");
    __cxa_throw(this_05,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &diagram2.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->diagram);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)&sw,
             &second->diagram);
  _n2 = 0.0;
  if (this->approx == -1) {
    sVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 &diagram2.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    min_ordinate._4_4_ = (int)sVar8;
    sVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 &sw);
    min_ordinate._0_4_ = (int)sVar8;
    min_abscissa = std::numeric_limits<double>::max();
    max_ordinate = std::numeric_limits<double>::max();
    max_abscissa = std::numeric_limits<double>::lowest();
    dStack_98 = std::numeric_limits<double>::lowest();
    for (local_9c = 0; local_9c < min_ordinate._0_4_; local_9c = local_9c + 1) {
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&sw,(long)local_9c);
      pdVar10 = std::min<double>(&min_abscissa,&pvVar9->second);
      min_abscissa = *pdVar10;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&sw,(long)local_9c);
      pdVar10 = std::min<double>(&max_ordinate,&pvVar9->first);
      max_ordinate = *pdVar10;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&sw,(long)local_9c);
      pdVar10 = std::max<double>(&max_abscissa,&pvVar9->second);
      max_abscissa = *pdVar10;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&sw,(long)local_9c);
      pdVar10 = std::max<double>(&stack0xffffffffffffff68,&pvVar9->first);
      dStack_98 = *pdVar10;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&sw,(long)local_9c);
      dVar27 = pvVar9->first;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&sw,(long)local_9c);
      local_a8 = (dVar27 + pvVar9->second) * 0.5;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&sw,(long)local_9c);
      dVar27 = pvVar9->first;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&sw,(long)local_9c);
      dStack_b0 = (dVar27 + pvVar9->second) * 0.5;
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      emplace_back<double,double>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &diagram2.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a8,
                 &stack0xffffffffffffff50);
    }
    for (local_b4 = 0; local_b4 < min_ordinate._4_4_; local_b4 = local_b4 + 1) {
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&diagram2.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_b4);
      pdVar10 = std::min<double>(&min_abscissa,&pvVar9->second);
      min_abscissa = *pdVar10;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&diagram2.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_b4);
      pdVar10 = std::min<double>(&max_ordinate,&pvVar9->first);
      max_ordinate = *pdVar10;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&diagram2.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_b4);
      pdVar10 = std::max<double>(&max_abscissa,&pvVar9->second);
      max_abscissa = *pdVar10;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&diagram2.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_b4);
      pdVar10 = std::max<double>(&stack0xffffffffffffff68,&pvVar9->first);
      dStack_98 = *pdVar10;
      this_00 = &diagram2.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)this_00,(long)local_b4);
      dVar27 = pvVar9->first;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)this_00,(long)local_b4);
      local_c0 = (dVar27 + pvVar9->second) * 0.5;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)this_00,(long)local_b4);
      dVar27 = pvVar9->first;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)this_00,(long)local_b4);
      dStack_c8 = (dVar27 + pvVar9->second) * 0.5;
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      emplace_back<double,double>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)&sw,
                 &local_c0,&stack0xffffffffffffff38);
    }
    sVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 &diagram2.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar6 = (int)sVar8;
    dVar27 = (max_abscissa - min_abscissa) * 0.0001;
    dVar28 = (dStack_98 - max_ordinate) * 0.0001;
    std::random_device::random_device((random_device *)&re);
    rVar7 = std::random_device::operator()((random_device *)&re);
    std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
    linear_congruential_engine
              ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               &uni._M_param._M_b,(ulong)rVar7);
    std::uniform_real_distribution<double>::uniform_real_distribution
              ((uniform_real_distribution<double> *)local_1488,-1.0,1.0);
    for (u._4_4_ = 0; u._4_4_ < iVar6; u._4_4_ = u._4_4_ + 1) {
      rVar29 = std::uniform_real_distribution<double>::operator()
                         ((uniform_real_distribution<double> *)local_1488,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          &uni._M_param._M_b);
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&diagram2.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)u._4_4_);
      pvVar9->first = rVar29 * dVar28 + pvVar9->first;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&diagram2.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)u._4_4_);
      pvVar9->second = rVar29 * dVar27 + pvVar9->second;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&sw,(long)u._4_4_);
      pvVar9->first = rVar29 * dVar28 + pvVar9->first;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)&sw,(long)u._4_4_);
      pvVar9->second = rVar29 * dVar27 + pvVar9->second;
    }
    std::
    vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
    ::vector((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
              *)&angles2.
                 super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
    ::vector((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
              *)&j);
    for (theta1._4_4_ = 0; iVar4 = theta1._4_4_, theta1._4_4_ < iVar6;
        theta1._4_4_ = theta1._4_4_ + 1) {
      while (theta1._0_4_ = iVar4 + 1, theta1._0_4_ < iVar6) {
        theta2 = compute_angle(this,(Persistence_diagram *)
                                    &diagram2.
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,theta1._4_4_
                               ,theta1._0_4_);
        local_14e0 = compute_angle(this,(Persistence_diagram *)&sw,theta1._4_4_,theta1._0_4_);
        std::pair<int,_int>::pair<int_&,_int_&,_true>
                  (&local_14e8,(int *)((long)&theta1 + 4),(int *)&theta1);
        std::
        vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
        ::emplace_back<double&,std::pair<int,int>>
                  ((vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
                    *)&angles2.
                       super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&theta2,&local_14e8);
        std::pair<int,_int>::pair<int_&,_int_&,_true>
                  (&local_14f0,(int *)((long)&theta1 + 4),(int *)&theta1);
        std::
        vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
        ::emplace_back<double&,std::pair<int,int>>
                  ((vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
                    *)&j,&local_14e0,&local_14f0);
        iVar4 = theta1._0_4_;
      }
    }
    pppVar1 = &angles2.
               super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar11 = std::
             vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
             ::begin((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                      *)pppVar1);
    iVar12 = std::
             vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
             ::end((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                    *)pppVar1);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<double,std::pair<int,int>>*,std::vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>>,Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(std::pair<double,std::pair<int,int>>const&,std::pair<double,std::pair<int,int>>const&)_1_>
              (iVar11._M_current,iVar12._M_current);
    iVar11 = std::
             vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
             ::begin((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                      *)&j);
    iVar12 = std::
             vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
             ::end((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                    *)&j);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<double,std::pair<int,int>>*,std::vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>>,Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(std::pair<double,std::pair<int,int>>const&,std::pair<double,std::pair<int,int>>const&)_2_>
              (iVar11._M_current,iVar12._M_current);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &orderp2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_1550);
    for (local_1554 = 0; local_1554 < iVar6; local_1554 = local_1554 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 &orderp2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_1554);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_1550,&local_1554);
    }
    this_01 = &orderp2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
    iVar13 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)this_01);
    iVar14 = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)this_01);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(int,int)_1_>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar13._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar14._M_current,
               (anon_class_8_1_d9b6cf3c)
               &diagram2.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar13 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_1550);
    iVar14 = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_1550);
    order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&sw;
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(int,int)_2_>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar13._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar14._M_current,
               (anon_class_8_1_d9b6cf3d)
               order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage);
    paVar2 = (allocator<int> *)
             ((long)&order2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(paVar2);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_15a0,(long)iVar6,paVar2);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&order2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    paVar2 = (allocator<int> *)
             ((long)&anglePerm1.
                     super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(paVar2);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&i_5,(long)iVar6,paVar2);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&anglePerm1.
                       super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    for (anglePerm1.
         super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        iVar4 = (int)anglePerm1.
                     super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
        (int)anglePerm1.
             super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage < iVar6;
        anglePerm1.
        super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)anglePerm1.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &orderp2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                           (long)(int)anglePerm1.
                                      super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_15a0,(long)*pvVar15);
      iVar5 = (int)anglePerm1.
                   super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *pvVar15 = iVar4;
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_1550,
                           (long)(int)anglePerm1.
                                      super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_5,(long)*pvVar15);
      *pvVar15 = iVar5;
    }
    this_02 = (allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               *)((long)&anglePerm2.
                         super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>::
    allocator(this_02);
    std::
    vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::vector((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
              *)local_15e0,(long)iVar6,this_02);
    std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>::
    ~allocator((allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                *)((long)&anglePerm2.
                          super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>::
    allocator((allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               *)((long)&i_6 + 3));
    std::
    vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::vector((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
              *)&m1,(long)iVar6,
             (allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
              *)((long)&i_6 + 3));
    std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>::
    ~allocator((allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                *)((long)&i_6 + 3));
    sVar8 = std::
            vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
            ::size((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                    *)&angles2.
                       super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_1608 = (int)sVar8;
    for (theta._4_4_ = 0; theta._4_4_ < local_1608; theta._4_4_ = theta._4_4_ + 1) {
      pppVar1 = &angles2.
                 super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar16 = std::
                vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                ::operator[]((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                              *)pppVar1,(long)theta._4_4_);
      _q = pvVar16->first;
      pvVar16 = std::
                vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                ::operator[]((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                              *)pppVar1,(long)theta._4_4_);
      a = (pvVar16->second).first;
      pvVar16 = std::
                vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                ::operator[]((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                              *)pppVar1,(long)theta._4_4_);
      b = (pvVar16->second).second;
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_15a0,(long)a);
      pvVar17 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                std::
                vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                              *)local_15e0,(long)*pvVar15);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double&>(pvVar17,&a,(double *)&q);
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_15a0,(long)b);
      pvVar17 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                std::
                vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                              *)local_15e0,(long)*pvVar15);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double&>(pvVar17,&b,(double *)&q);
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_15a0,(long)a);
      m2 = *pvVar15;
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_15a0,(long)b);
      vVar3 = *pvVar15;
      i_7 = vVar3;
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_15a0,(long)a);
      iVar4 = m2;
      *pvVar15 = vVar3;
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_15a0,(long)b);
      *pvVar15 = iVar4;
    }
    sVar8 = std::
            vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
            ::size((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                    *)&j);
    theta_1._4_4_ = (int)sVar8;
    for (theta_1._0_4_ = 0; theta_1._0_4_ < theta_1._4_4_; theta_1._0_4_ = theta_1._0_4_ + 1) {
      pvVar16 = std::
                vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                ::operator[]((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                              *)&j,(long)theta_1._0_4_);
      _q_1 = pvVar16->first;
      pvVar16 = std::
                vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                ::operator[]((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                              *)&j,(long)theta_1._0_4_);
      a_1 = (pvVar16->second).first;
      pvVar16 = std::
                vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                ::operator[]((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                              *)&j,(long)theta_1._0_4_);
      b_1 = (pvVar16->second).second;
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_5,(long)a_1);
      pvVar17 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                std::
                vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                              *)&m1,(long)*pvVar15);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double&>(pvVar17,&a_1,(double *)&q_1);
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_5,(long)b_1);
      pvVar17 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                std::
                vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                              *)&m1,(long)*pvVar15);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double&>(pvVar17,&b_1,(double *)&q_1);
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_5,(long)a_1);
      i_8 = *pvVar15;
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_5,(long)b_1);
      vVar3 = *pvVar15;
      local_1648 = vVar3;
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_5,(long)a_1);
      iVar4 = i_8;
      *pvVar15 = vVar3;
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_5,(long)b_1);
      *pvVar15 = iVar4;
    }
    for (local_164c = 0; local_164c < iVar6; local_164c = local_164c + 1) {
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_15a0,(long)local_164c);
      pvVar17 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                std::
                vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                              *)local_15e0,(long)*pvVar15);
      local_1658 = 1.5707963267948966;
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double>(pvVar17,&local_164c,&local_1658);
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&i_5,(long)local_164c);
      pvVar17 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                std::
                vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                              *)&m1,(long)*pvVar15);
      dStack_1660 = 1.5707963267948966;
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double>(pvVar17,&local_164c,&stack0xffffffffffffe9a0);
    }
    for (u_1.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        u_1.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < iVar6;
        u_1.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             u_1.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      this_03 = &v.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)this_03
                );
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 &theta1_1);
      pvVar18 = std::
                vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                              *)local_15e0,
                             (long)u_1.
                                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)this_03
                 ,pvVar18);
      pvVar18 = std::
                vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                              *)&m1,(long)u_1.
                                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 &theta1_1,pvVar18);
      theta2_1 = -1.5707963267948966;
      step._4_4_ = 0;
      step._0_4_ = 0;
      pvVar19 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            *)&v.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      pvVar20 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            *)&theta1_1,0);
      pdVar10 = std::min<double>(&pvVar19->second,&pvVar20->second);
      _kv = *pdVar10;
      while ((theta2_1 != 1.5707963267948966 || (NAN(theta2_1)))) {
        pvVar19 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)&v.
                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (ulong)step._4_4_);
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)&diagram2.
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)pvVar19->first);
        dVar27 = pvVar9->first;
        pvVar19 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)&theta1_1,(ulong)step._0_4_);
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)&sw,(long)pvVar19->first);
        if ((dVar27 != pvVar9->first) || (NAN(dVar27) || NAN(pvVar9->first))) {
LAB_0010d84e:
          if ((theta2_1 != _kv) || (NAN(theta2_1) || NAN(_kv))) {
            pvVar19 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ::operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                    *)&v.
                                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (ulong)step._4_4_);
            iVar4 = pvVar19->first;
            pvVar19 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ::operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                    *)&theta1_1,(ulong)step._0_4_);
            dVar27 = compute_int(this,theta2_1,_kv,iVar4,pvVar19->first,
                                 (Persistence_diagram *)
                                 &diagram2.
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (Persistence_diagram *)&sw);
            _n2 = dVar27 + _n2;
          }
        }
        else {
          pvVar19 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                    operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                *)&v.
                                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)step._4_4_);
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)&diagram2.
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)pvVar19->first);
          dVar27 = pvVar9->second;
          pvVar19 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                    operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                *)&theta1_1,(ulong)step._0_4_);
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               *)&sw,(long)pvVar19->first);
          if ((dVar27 != pvVar9->second) || (NAN(dVar27) || NAN(pvVar9->second))) goto LAB_0010d84e;
        }
        theta2_1 = _kv;
        pvVar19 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)&v.
                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (ulong)step._4_4_);
        if (((_kv == pvVar19->second) && (!NAN(_kv) && !NAN(pvVar19->second))) &&
           (sVar8 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                    size((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                         )&v.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage),
           (ulong)step._4_4_ < sVar8 - 1)) {
          step._4_4_ = step._4_4_ + 1;
        }
        pvVar19 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)&theta1_1,(ulong)step._0_4_);
        if (((_kv == pvVar19->second) && (!NAN(_kv) && !NAN(pvVar19->second))) &&
           (sVar8 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                    size((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                         )&theta1_1), (ulong)step._0_4_ < sVar8 - 1)) {
          step._0_4_ = step._0_4_ + 1;
        }
        pvVar19 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)&v.
                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (ulong)step._4_4_);
        pvVar20 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                  operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)&theta1_1,(ulong)step._0_4_);
        pdVar10 = std::min<double>(&pvVar19->second,&pvVar20->second);
        _kv = *pdVar10;
      }
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 &theta1_1);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 &v.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::~vector((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               *)&m1);
    std::
    vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::~vector((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               *)local_15e0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_5);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_15a0)
    ;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1550)
    ;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &orderp2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
    ::~vector((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
               *)&j);
    std::
    vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
    ::~vector((vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
               *)&angles2.
                  super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::random_device::~random_device((random_device *)&re);
  }
  else {
    iVar6 = this->approx;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_16e8);
    for (local_16ec = 0; local_16ec < this->approx; local_16ec = local_16ec + 1) {
      this_04 = &v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)this_04);
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)local_16e8);
      pvVar21 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&this->projections,(long)local_16ec);
      cVar22 = std::vector<double,_std::allocator<double>_>::begin(pvVar21);
      pvVar21 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&this->projections,(long)local_16ec);
      cVar23 = std::vector<double,_std::allocator<double>_>::end(pvVar21);
      pvVar21 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&second->projections_diagonal,(long)local_16ec);
      cVar24 = std::vector<double,_std::allocator<double>_>::begin(pvVar21);
      pvVar21 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&second->projections_diagonal,(long)local_16ec);
      cVar25 = std::vector<double,_std::allocator<double>_>::end(pvVar21);
      bVar26 = std::back_inserter<std::vector<double,std::allocator<double>>>
                         ((vector<double,_std::allocator<double>_> *)this_04);
      std::
      merge<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 cVar22._M_current,
                 (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 cVar23._M_current,
                 (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 cVar24._M_current,
                 (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 cVar25._M_current,bVar26);
      pvVar21 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&second->projections,(long)local_16ec);
      cVar22 = std::vector<double,_std::allocator<double>_>::begin(pvVar21);
      pvVar21 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&second->projections,(long)local_16ec);
      cVar23 = std::vector<double,_std::allocator<double>_>::end(pvVar21);
      pvVar21 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&this->projections_diagonal,(long)local_16ec);
      cVar24 = std::vector<double,_std::allocator<double>_>::begin(pvVar21);
      pvVar21 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&this->projections_diagonal,(long)local_16ec);
      cVar25 = std::vector<double,_std::allocator<double>_>::end(pvVar21);
      bVar26 = std::back_inserter<std::vector<double,std::allocator<double>>>
                         ((vector<double,_std::allocator<double>_> *)local_16e8);
      std::
      merge<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 cVar22._M_current,
                 (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 cVar23._M_current,
                 (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 cVar24._M_current,
                 (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 cVar25._M_current,bVar26);
      sVar8 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)
                         &v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      dStack_1760 = 0.0;
      for (local_1764 = 0; local_1764 < (int)sVar8; local_1764 = local_1764 + 1) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)
                   &v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(long)local_1764);
        this_06 = (vector<double,_std::allocator<double>_> *)local_16e8;
        std::vector<double,_std::allocator<double>_>::operator[](this_06,(long)local_1764);
        std::abs((int)this_06);
        dStack_1760 = extraout_XMM0_Qa + dStack_1760;
      }
      _n2 = dStack_1760 * (3.141592653589793 / (double)iVar6) + _n2;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_16e8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  dVar27 = _n2 / 3.141592653589793;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)&sw);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &diagram2.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return dVar27;
}

Assistant:

double compute_sliced_wasserstein_distance(const Sliced_Wasserstein& second) const {
    GUDHI_CHECK(this->approx == second.approx,
                std::invalid_argument("Error: different approx values for representations"));

    Persistence_diagram diagram1 = this->diagram;
    Persistence_diagram diagram2 = second.diagram;
    double sw = 0;

    if (this->approx == -1) {
      // Add projections onto diagonal.
      int n1, n2;
      n1 = diagram1.size();
      n2 = diagram2.size();
      double min_ordinate = std::numeric_limits<double>::max();
      double min_abscissa = std::numeric_limits<double>::max();
      double max_ordinate = std::numeric_limits<double>::lowest();
      double max_abscissa = std::numeric_limits<double>::lowest();
      for (int i = 0; i < n2; i++) {
        min_ordinate = std::min(min_ordinate, diagram2[i].second);
        min_abscissa = std::min(min_abscissa, diagram2[i].first);
        max_ordinate = std::max(max_ordinate, diagram2[i].second);
        max_abscissa = std::max(max_abscissa, diagram2[i].first);
        diagram1.emplace_back((diagram2[i].first + diagram2[i].second) / 2,
                              (diagram2[i].first + diagram2[i].second) / 2);
      }
      for (int i = 0; i < n1; i++) {
        min_ordinate = std::min(min_ordinate, diagram1[i].second);
        min_abscissa = std::min(min_abscissa, diagram1[i].first);
        max_ordinate = std::max(max_ordinate, diagram1[i].second);
        max_abscissa = std::max(max_abscissa, diagram1[i].first);
        diagram2.emplace_back((diagram1[i].first + diagram1[i].second) / 2,
                              (diagram1[i].first + diagram1[i].second) / 2);
      }
      int num_pts_dgm = diagram1.size();

      // Slightly perturb the points so that the PDs are in generic positions.
      double epsilon = 0.0001;
      double thresh_y = (max_ordinate - min_ordinate) * epsilon;
      double thresh_x = (max_abscissa - min_abscissa) * epsilon;
      std::random_device rd;
      std::default_random_engine re(rd());
      std::uniform_real_distribution<double> uni(-1, 1);
      for (int i = 0; i < num_pts_dgm; i++) {
        double u = uni(re);
        diagram1[i].first += u * thresh_x;
        diagram1[i].second += u * thresh_y;
        diagram2[i].first += u * thresh_x;
        diagram2[i].second += u * thresh_y;
      }

      // Compute all angles in both PDs.
      std::vector<std::pair<double, std::pair<int, int> > > angles1, angles2;
      for (int i = 0; i < num_pts_dgm; i++) {
        for (int j = i + 1; j < num_pts_dgm; j++) {
          double theta1 = compute_angle(diagram1, i, j);
          double theta2 = compute_angle(diagram2, i, j);
          angles1.emplace_back(theta1, std::pair<int, int>(i, j));
          angles2.emplace_back(theta2, std::pair<int, int>(i, j));
        }
      }

      // Sort angles.
      std::sort(angles1.begin(), angles1.end(),
                [](const std::pair<double, std::pair<int, int> >& p1,
                   const std::pair<double, std::pair<int, int> >& p2) { return (p1.first < p2.first); });
      std::sort(angles2.begin(), angles2.end(),
                [](const std::pair<double, std::pair<int, int> >& p1,
                   const std::pair<double, std::pair<int, int> >& p2) { return (p1.first < p2.first); });

      // Initialize orders of the points of both PDs (given by ordinates when theta = -pi/2).
      std::vector<int> orderp1, orderp2;
      for (int i = 0; i < num_pts_dgm; i++) {
        orderp1.push_back(i);
        orderp2.push_back(i);
      }
      std::sort(orderp1.begin(), orderp1.end(), [&](int i, int j) {
        if (diagram1[i].second != diagram1[j].second)
          return (diagram1[i].second < diagram1[j].second);
        else
          return (diagram1[i].first > diagram1[j].first);
      });
      std::sort(orderp2.begin(), orderp2.end(), [&](int i, int j) {
        if (diagram2[i].second != diagram2[j].second)
          return (diagram2[i].second < diagram2[j].second);
        else
          return (diagram2[i].first > diagram2[j].first);
      });

      // Find the inverses of the orders.
      std::vector<int> order1(num_pts_dgm);
      std::vector<int> order2(num_pts_dgm);
      for (int i = 0; i < num_pts_dgm; i++) {
        order1[orderp1[i]] = i;
        order2[orderp2[i]] = i;
      }

      // Record all inversions of points in the orders as theta varies along the positive half-disk.
      std::vector<std::vector<std::pair<int, double> > > anglePerm1(num_pts_dgm);
      std::vector<std::vector<std::pair<int, double> > > anglePerm2(num_pts_dgm);

      int m1 = angles1.size();
      for (int i = 0; i < m1; i++) {
        double theta = angles1[i].first;
        int p = angles1[i].second.first;
        int q = angles1[i].second.second;
        anglePerm1[order1[p]].emplace_back(p, theta);
        anglePerm1[order1[q]].emplace_back(q, theta);
        int a = order1[p];
        int b = order1[q];
        order1[p] = b;
        order1[q] = a;
      }

      int m2 = angles2.size();
      for (int i = 0; i < m2; i++) {
        double theta = angles2[i].first;
        int p = angles2[i].second.first;
        int q = angles2[i].second.second;
        anglePerm2[order2[p]].emplace_back(p, theta);
        anglePerm2[order2[q]].emplace_back(q, theta);
        int a = order2[p];
        int b = order2[q];
        order2[p] = b;
        order2[q] = a;
      }

      for (int i = 0; i < num_pts_dgm; i++) {
        anglePerm1[order1[i]].emplace_back(i, pi / 2);
        anglePerm2[order2[i]].emplace_back(i, pi / 2);
      }

      // Compute the SW distance with the list of inversions.
      for (int i = 0; i < num_pts_dgm; i++) {
        std::vector<std::pair<int, double> > u, v;
        u = anglePerm1[i];
        v = anglePerm2[i];
        double theta1, theta2;
        theta1 = -pi / 2;
        unsigned int ku, kv;
        ku = 0;
        kv = 0;
        theta2 = std::min(u[ku].second, v[kv].second);
        while (theta1 != pi / 2) {
          if (diagram1[u[ku].first].first != diagram2[v[kv].first].first ||
              diagram1[u[ku].first].second != diagram2[v[kv].first].second)
            if (theta1 != theta2) sw += compute_int(theta1, theta2, u[ku].first, v[kv].first, diagram1, diagram2);
          theta1 = theta2;
          if ((theta2 == u[ku].second) && ku < u.size() - 1) ku++;
          if ((theta2 == v[kv].second) && kv < v.size() - 1) kv++;
          theta2 = std::min(u[ku].second, v[kv].second);
        }
      }
    } else {
      double step = pi / this->approx;
      std::vector<double> v1, v2;
      for (int i = 0; i < this->approx; i++) {
        v1.clear();
        v2.clear();
        std::merge(this->projections[i].begin(), this->projections[i].end(), second.projections_diagonal[i].begin(),
                   second.projections_diagonal[i].end(), std::back_inserter(v1));
        std::merge(second.projections[i].begin(), second.projections[i].end(), this->projections_diagonal[i].begin(),
                   this->projections_diagonal[i].end(), std::back_inserter(v2));

        int n = v1.size();
        double f = 0;
        for (int j = 0; j < n; j++) f += std::abs(v1[j] - v2[j]);
        sw += f * step;
      }
    }

    return sw / pi;
  }